

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O1

void HighsTaskExecutor::initialize(int numThreads)

{
  long *plVar1;
  void *pvVar2;
  HighsTaskExecutor *this;
  
  globalExecutorHandle::__tls_init();
  plVar1 = (long *)__tls_get_addr(&PTR_00449d38);
  if (*plVar1 == 0) {
    *(undefined1 *)(plVar1 + 1) = 1;
    pvVar2 = operator_new(0x88);
    *(void **)(((ulong)pvVar2 | 0x3f) - 7) = pvVar2;
    this = (HighsTaskExecutor *)(((ulong)pvVar2 | 0x3f) + 1);
    HighsTaskExecutor(this,numThreads);
    *plVar1 = (long)this;
  }
  return;
}

Assistant:

static void initialize(int numThreads) {
    auto& executorHandle = threadLocalExecutorHandle();
    if (executorHandle.ptr == nullptr) {
      executorHandle.isMain = true;
      executorHandle.ptr = new (cache_aligned::alloc(sizeof(HighsTaskExecutor)))
          HighsTaskExecutor(numThreads);
    }
  }